

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O0

Component __thiscall
ftxui::Slider<int>(ftxui *this,ConstStringRef *label,int *value,int min,int max,int increment)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Component CVar1;
  undefined1 local_40 [28];
  int increment_local;
  int max_local;
  int min_local;
  int *value_local;
  ConstStringRef *label_local;
  
  local_40._20_4_ = increment;
  local_40._24_4_ = max;
  increment_local = min;
  _max_local = (string *)value;
  value_local = (int *)label;
  label_local = (ConstStringRef *)this;
  Make<ftxui::SliderBase<int>,ftxui::ConstStringRef,int*&,int&,int&,int&>
            ((ConstStringRef *)local_40,(int **)label,&max_local,&increment_local,
             (int *)(local_40 + 0x18));
  std::shared_ptr<ftxui::ComponentBase>::shared_ptr<ftxui::SliderBase<int>,void>
            ((shared_ptr<ftxui::ComponentBase> *)this,
             (shared_ptr<ftxui::SliderBase<int>_> *)local_40);
  std::shared_ptr<ftxui::SliderBase<int>_>::~shared_ptr
            ((shared_ptr<ftxui::SliderBase<int>_> *)local_40);
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Component)CVar1.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Component Slider(ConstStringRef label, T* value, T min, T max, T increment) {
  return Make<SliderBase<T>>(std::move(label), value, min, max, increment);
}